

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::render
               (Functions *gl,deUint32 program,int targetWidth,int targetHeight,int x,int y,
               int width,int height)

{
  GLuint GVar1;
  GLenum GVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float local_58;
  float local_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float local_44;
  float local_40;
  undefined8 local_3c;
  undefined8 uStack_34;
  float local_2c;
  
  auVar4._0_4_ = (float)targetHeight;
  auVar4._4_4_ = (float)targetWidth;
  auVar4._8_8_ = 0;
  auVar3 = divps(ZEXT816(0x4310000042000000),auVar4);
  local_54 = auVar3._0_4_ + -1.0;
  fStack_50 = auVar3._4_4_ + -1.0;
  auVar4 = divps(ZEXT816(0x4180000043300000),auVar4);
  local_44 = auVar4._0_4_ + -1.0;
  local_58 = auVar4._4_4_ + -1.0;
  local_3c = CONCAT44(local_58,local_44);
  fStack_4c = local_54;
  fStack_48 = fStack_50;
  local_40 = fStack_50;
  uStack_34 = local_3c;
  local_2c = local_54;
  (*gl->useProgram)(program);
  GVar1 = (*gl->getAttribLocation)(program,"a_pos");
  (*gl->enableVertexAttribArray)(GVar1);
  (*gl->vertexAttribPointer)(GVar1,2,0x1406,'\0',0,&local_58);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xf8);
  (*gl->viewport)(0,0,targetWidth,targetHeight);
  (*gl->drawArrays)(4,0,6);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xfc);
  return;
}

Assistant:

void render (const glw::Functions& gl, deUint32 program, int targetWidth, int targetHeight, int x, int y, int width, int height)
{
	const tcu::Vec2 positions[] =
	{
		toGLCoord(targetWidth, targetHeight, x,			y),
		toGLCoord(targetWidth, targetHeight, x+width,	y),
		toGLCoord(targetWidth, targetHeight, x+width,	y+height),

		toGLCoord(targetWidth, targetHeight, x+width,	y+height),
		toGLCoord(targetWidth, targetHeight, x,			y+height),
		toGLCoord(targetWidth, targetHeight, x,			y)
	};

	deUint32 posLocation;

	gl.useProgram(program);
	posLocation	= gl.getAttribLocation(program, "a_pos");
	gl.enableVertexAttribArray(posLocation);
	gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

	gl.viewport(0, 0, targetWidth, targetHeight);
	gl.drawArrays(GL_TRIANGLES, 0, 6);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");
}